

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O1

void shuff_indirect_sort(uint64_t *freq,uint64_t *syms,uint64_t *a,uint64_t n)

{
  uint64_t *puVar1;
  undefined8 uVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint64_t uVar12;
  uint64_t *puVar13;
  ulong uVar14;
  
LAB_00122dac:
  if (6 < n) {
    puVar4 = a + (n >> 1);
    if (n != 7) {
      puVar5 = a + (n - 1);
      puVar3 = a;
      if (0x28 < n) {
        uVar9 = n & 0xfffffffffffffff8;
        puVar3 = shuff_med3(a,(uint64_t *)((long)a + uVar9),a + (n >> 3) * 2,freq);
        puVar4 = shuff_med3((uint64_t *)((long)puVar4 - uVar9),puVar4,
                            (uint64_t *)((long)puVar4 + uVar9),freq);
        puVar5 = shuff_med3(puVar5 + (n >> 3) * -2,(uint64_t *)((long)puVar5 - uVar9),puVar5,freq);
      }
      puVar4 = shuff_med3(puVar3,puVar4,puVar5,freq);
    }
    uVar7 = *a;
    *a = *puVar4;
    *puVar4 = uVar7;
    puVar4 = a + 1;
    puVar5 = a + (n - 1);
    puVar3 = puVar4;
    puVar13 = puVar5;
    do {
      for (; puVar4 <= puVar5; puVar4 = puVar4 + 1) {
        uVar7 = freq[*puVar4];
        uVar6 = freq[*a];
        if (uVar7 != uVar6 && -1 < (long)(uVar7 - uVar6)) break;
        if (uVar7 == uVar6) {
          uVar7 = *puVar3;
          *puVar3 = *puVar4;
          *puVar4 = uVar7;
          puVar3 = puVar3 + 1;
        }
      }
      if (puVar5 < puVar4) goto LAB_00122f1f;
      uVar7 = *puVar5;
      uVar12 = freq[*a];
      uVar6 = freq[uVar7];
      while (-1 < (long)(uVar6 - uVar12)) {
        if (uVar6 == uVar12) {
          *puVar5 = *puVar13;
          *puVar13 = uVar7;
          puVar13 = puVar13 + -1;
        }
        puVar1 = puVar5 + -1;
        if (puVar1 < puVar4) {
          puVar5 = puVar5 + -1;
          goto LAB_00122f1f;
        }
        uVar7 = *puVar1;
        uVar12 = freq[*a];
        puVar5 = puVar1;
        uVar6 = freq[uVar7];
      }
      if (puVar5 < puVar4) goto LAB_00122f1f;
      uVar7 = *puVar4;
      *puVar4 = *puVar5;
      *puVar5 = uVar7;
      puVar4 = puVar4 + 1;
      puVar5 = puVar5 + -1;
    } while( true );
  }
  if (1 < n) {
    puVar4 = a + 1;
    puVar5 = puVar4;
joined_r0x00122ffb:
    do {
      if (a < puVar4) {
        uVar7 = *puVar4;
        if (freq[puVar4[-1]] != freq[uVar7] && -1 < (long)(freq[puVar4[-1]] - freq[uVar7])) {
          *puVar4 = puVar4[-1];
          puVar4[-1] = uVar7;
          puVar4 = puVar4 + -1;
          goto joined_r0x00122ffb;
        }
      }
      puVar4 = puVar5 + 1;
      puVar5 = puVar4;
    } while (puVar4 < a + n);
  }
  return;
LAB_00122f1f:
  uVar7 = (long)puVar3 - (long)a >> 3;
  uVar6 = (long)puVar4 - (long)puVar3 >> 3;
  if ((long)uVar6 <= (long)uVar7) {
    uVar7 = uVar6;
  }
  if (0 < (long)uVar7) {
    lVar8 = uVar7 + 1;
    lVar11 = 0;
    do {
      uVar2 = *(undefined8 *)((long)a + lVar11);
      *(undefined8 *)((long)a + lVar11) = *(undefined8 *)((long)puVar4 + lVar11 + uVar7 * -8);
      *(undefined8 *)((long)puVar4 + lVar11 + uVar7 * -8) = uVar2;
      lVar8 = lVar8 + -1;
      lVar11 = lVar11 + 8;
    } while (1 < lVar8);
  }
  uVar14 = (long)puVar13 - (long)puVar5 >> 3;
  uVar9 = ((long)((long)a + (n * 8 - (long)puVar13)) >> 3) - 1;
  if ((long)uVar14 < (long)uVar9) {
    uVar9 = uVar14;
  }
  if (0 < (long)uVar9) {
    lVar8 = uVar9 * -8 + n * 8;
    lVar11 = uVar9 + 1;
    lVar10 = 0;
    do {
      uVar2 = *(undefined8 *)((long)puVar4 + lVar10);
      *(undefined8 *)((long)puVar4 + lVar10) = *(undefined8 *)((long)a + lVar10 + lVar8);
      *(undefined8 *)((long)a + lVar10 + lVar8) = uVar2;
      lVar11 = lVar11 + -1;
      lVar10 = lVar10 + 8;
    } while (1 < lVar11);
  }
  if (1 < (long)uVar6) {
    shuff_indirect_sort(freq,syms,a,uVar6);
  }
  if ((long)uVar14 < 2) {
    return;
  }
  a = a + (n - uVar14);
  n = uVar14;
  goto LAB_00122dac;
}

Assistant:

void shuff_indirect_sort(
    uint64_t* freq, uint64_t* syms, uint64_t* a, uint64_t n)
{
    uint64_t *pa, *pb, *pc, *pd, *pl, *pm, *pn;
    int64_t d, r;
    const int64_t es = 1;

    if (n < 7) {
        for (pm = a + es; pm < a + n * es; pm += es)
            for (pl = pm; pl > a && shuff_cmp(pl - es, pl, freq) > 0; pl -= es)
                shuff_swap(pl, pl - es);
        return;
    }
    pm = a + (n / 2) * es;
    if (n > 7) {
        pl = a;
        pn = a + (n - 1) * es;
        if (n > 40) {
            d = (n / 8) * es;
            pl = shuff_med3(pl, pl + d, pl + 2 * d, freq);
            pm = shuff_med3(pm - d, pm, pm + d, freq);
            pn = shuff_med3(pn - 2 * d, pn - d, pn, freq);
        }
        pm = shuff_med3(pl, pm, pn, freq);
    }
    shuff_swap(a, pm);
    pa = pb = a + es;

    pc = pd = a + (n - 1) * es;
    for (;;) {
        while (pb <= pc && (r = shuff_cmp(pb, a, freq)) <= 0) {
            if (r == 0) {
                shuff_swap(pa, pb);
                pa += es;
            }
            pb += es;
        }
        while (pb <= pc && (r = shuff_cmp(pc, a, freq)) >= 0) {
            if (r == 0) {
                shuff_swap(pc, pd);
                pd -= es;
            }
            pc -= es;
        }
        if (pb > pc)
            break;
        shuff_swap(pb, pc);
        pb += es;
        pc -= es;
    }
    pn = a + n * es;
    r = shuff_min(pa - a, pb - pa);
    vecshuff_swap(a, pb - r, r);
    r = shuff_min(pd - pc, pn - pd - es);
    vecshuff_swap(pb, pn - r, r);
    if ((r = pb - pa) > es)
        shuff_indirect_sort(freq, syms, a, r / es);
    if ((r = pd - pc) > es)
        shuff_indirect_sort(freq, syms, pn - r, r / es);
}